

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_sort.cc
# Opt level: O0

void unique_sort_features(uint64_t parse_mask,example *ae)

{
  bool bVar1;
  long in_RSI;
  features *fs;
  iterator __end1;
  iterator __begin1;
  example *__range1;
  int in_stack_0000005c;
  features *in_stack_00000060;
  uint64_t in_stack_000000f0;
  features *in_stack_000000f8;
  example_predict *in_stack_ffffffffffffffc0;
  iterator local_38;
  iterator local_28;
  long local_10;
  
  local_10 = in_RSI;
  local_28 = example_predict::begin(in_stack_ffffffffffffffc0);
  local_38 = example_predict::end(in_stack_ffffffffffffffc0);
  while (bVar1 = example_predict::iterator::operator!=(&local_28,&local_38), bVar1) {
    example_predict::iterator::operator*(&local_28);
    bVar1 = features::sort(in_stack_000000f8,in_stack_000000f0);
    if (bVar1) {
      unique_features(in_stack_00000060,in_stack_0000005c);
    }
    example_predict::iterator::operator++(&local_28);
  }
  *(undefined1 *)(local_10 + 0x68ca) = 1;
  return;
}

Assistant:

void unique_sort_features(uint64_t parse_mask, example* ae)
{
  for (features& fs : *ae)
    if (fs.sort(parse_mask))
      unique_features(fs);

  ae->sorted = true;
}